

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# label_dictionary.cc
# Opt level: O0

void LabelDict::del_example_namespaces_from_example(example *target,example *source)

{
  size_t sVar1;
  uchar **ppuVar2;
  features *in_RSI;
  undefined8 in_RDI;
  example *unaff_retaddr;
  namespace_index *idx;
  uchar *local_18;
  
  sVar1 = v_array<unsigned_char>::size((v_array<unsigned_char> *)in_RSI);
  if (sVar1 != 0) {
    ppuVar2 = v_array<unsigned_char>::end((v_array<unsigned_char> *)in_RSI);
    local_18 = *ppuVar2;
    while( true ) {
      local_18 = local_18 + -1;
      ppuVar2 = v_array<unsigned_char>::begin((v_array<unsigned_char> *)in_RSI);
      if (local_18 < *ppuVar2) break;
      if (*local_18 != 0x80) {
        del_example_namespace(unaff_retaddr,(namespace_index)((ulong)in_RDI >> 0x38),in_RSI);
      }
    }
  }
  return;
}

Assistant:

void del_example_namespaces_from_example(example& target, example& source)
{
  if (source.indices.size() == 0)  // making sure we can deal with empty shared example
    return;
  namespace_index* idx = source.indices.end();
  idx--;
  for (; idx >= source.indices.begin(); idx--)
  {
    if (*idx == constant_namespace)
      continue;
    del_example_namespace(target, *idx, source.feature_space[*idx]);
  }
}